

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O0

void msd_A(cacheblock_t *cache,size_t N,size_t cache_depth,size_t true_depth)

{
  size_t sVar1;
  void *__src;
  undefined8 *puVar2;
  uint local_854;
  size_t sStack_850;
  uint i_3;
  size_t bsum;
  size_t i_2;
  uint i_1;
  cacheblock_t *sorted;
  size_t i;
  size_t bucketsize [256];
  size_t true_depth_local;
  size_t cache_depth_local;
  size_t N_local;
  cacheblock_t *cache_local;
  
  bucketsize[0xff] = true_depth;
  if (N < 0x20) {
    inssort_cache(cache,(int)N,true_depth);
  }
  else {
    true_depth_local = cache_depth;
    if (3 < cache_depth) {
      fill_cache(cache,N,true_depth);
      true_depth_local = 0;
    }
    memset(&i,0,0x800);
    for (sorted = (cacheblock_t *)0x0; sorted < N; sorted = (cacheblock_t *)(sorted->bytes + 1)) {
      bucketsize[(ulong)cache[(long)sorted].bytes[true_depth_local] - 1] =
           bucketsize[(ulong)cache[(long)sorted].bytes[true_depth_local] - 1] + 1;
    }
    __src = malloc(N << 4);
    msd_A::bucketindex[0] = 0;
    for (i_2._4_4_ = 1; i_2._4_4_ < 0x100; i_2._4_4_ = i_2._4_4_ + 1) {
      msd_A::bucketindex[i_2._4_4_] =
           msd_A::bucketindex[i_2._4_4_ - 1] + bucketsize[(ulong)(i_2._4_4_ - 1) - 1];
    }
    for (bsum = 0; bsum < N; bsum = bsum + 1) {
      sVar1 = msd_A::bucketindex[cache[bsum].bytes[true_depth_local]];
      msd_A::bucketindex[cache[bsum].bytes[true_depth_local]] = sVar1 + 1;
      puVar2 = (undefined8 *)((long)__src + sVar1 * 0x10);
      *puVar2 = *(undefined8 *)(cache + bsum);
      puVar2[1] = cache[bsum].ptr;
    }
    memcpy(cache,__src,N << 4);
    free(__src);
    sStack_850 = i;
    for (local_854 = 1; local_854 < 0x100; local_854 = local_854 + 1) {
      if (bucketsize[(ulong)local_854 - 1] != 0) {
        msd_A(cache + sStack_850,bucketsize[(ulong)local_854 - 1],true_depth_local + 1,
              bucketsize[0xff] + 1);
        sStack_850 = bucketsize[(ulong)local_854 - 1] + sStack_850;
      }
    }
  }
  return;
}

Assistant:

static void
msd_A(cacheblock_t* cache, size_t N, size_t cache_depth, size_t true_depth)
{
	if (N < 32) {
		inssort_cache(cache, N, true_depth);
		return;
	}
	if (cache_depth >= CACHED_BYTES) {
		fill_cache(cache, N, true_depth);
		cache_depth = 0;
	}
	size_t bucketsize[256] = {0};
	for (size_t i=0; i < N; ++i)
		++bucketsize[cache[i].bytes[cache_depth]];
	cacheblock_t* sorted = (cacheblock_t*)
		malloc(N*sizeof(cacheblock_t));
	static size_t bucketindex[256];
	bucketindex[0] = 0;
	for (unsigned i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
	for (size_t i=0; i < N; ++i)
		memcpy(&sorted[bucketindex[cache[i].bytes[cache_depth]]++],
				cache+i, sizeof(cacheblock_t));
	memcpy(cache, sorted, N*sizeof(cacheblock_t));
	free(sorted);
	size_t bsum = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_A(cache+bsum, bucketsize[i],
			  cache_depth+1, true_depth+1);
		bsum += bucketsize[i];
	}
}